

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O3

void __thiscall
ModelFlattening_multiLayeredImportOfNonStandardUnits_Test::
~ModelFlattening_multiLayeredImportOfNonStandardUnits_Test
          (ModelFlattening_multiLayeredImportOfNonStandardUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ModelFlattening, multiLayeredImportOfNonStandardUnits)
{
    auto parser = libcellml::Parser::create(false);
    auto model = parser->parseModel(fileContents("importer/periodicstimulus/experiments/periodic-stimulus.xml"));

    EXPECT_EQ(size_t(0), parser->errorCount());

    auto validator = libcellml::Validator::create();

    validator->validateModel(model);

    EXPECT_EQ(size_t(0), validator->issueCount());
    EXPECT_TRUE(model->hasUnresolvedImports());

    auto importer = libcellml::Importer::create(false);

    importer->resolveImports(model, resourcePath("importer/periodicstimulus/experiments"));

    EXPECT_FALSE(model->hasUnresolvedImports());

    auto flattenModel = importer->flattenModel(model);

    EXPECT_NE(nullptr, flattenModel);
}